

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O2

c_v64 c_v64_pack_s16_s8(c_v64 a,c_v64 b)

{
  undefined1 auVar1 [32];
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  auVar7 = vpinsrd_avx(ZEXT416(a.u32[1]),(int)((ulong)a >> 0x10),1);
  auVar7 = vpinsrd_avx(auVar7,a.u32[0],2);
  uVar3 = b.s32[1] >> 0x10;
  uVar4 = 0xffffff80;
  if ((int)uVar3 < -0x7f) {
    uVar3 = uVar4;
  }
  uVar6 = 0x7f;
  if (0x7e < (int)uVar3) {
    uVar3 = uVar6;
  }
  uVar5 = (int)((ulong)b >> 0x10) >> 0x10;
  if ((int)uVar5 < -0x7f) {
    uVar5 = uVar4;
  }
  if (0x7e < (int)uVar5) {
    uVar5 = uVar6;
  }
  uVar2 = b.s32[0] >> 0x10;
  if ((int)uVar2 < -0x7f) {
    uVar2 = uVar4;
  }
  if (0x7e < (int)uVar2) {
    uVar2 = uVar6;
  }
  uVar4 = 0xffffff80;
  if (-0x80 < b.s16[0]) {
    uVar4 = (int)b.s16[0];
  }
  if (0x7e < (int)uVar4) {
    uVar4 = uVar6;
  }
  auVar7 = vpinsrd_avx(auVar7,a.u32[0] << 0x10,3);
  auVar7 = vpsrad_avx(auVar7,0x10);
  auVar8._8_4_ = 0xffffff80;
  auVar8._0_8_ = 0xffffff80ffffff80;
  auVar8._12_4_ = 0xffffff80;
  auVar9._8_4_ = 0x7f;
  auVar9._0_8_ = 0x7f0000007f;
  auVar9._12_4_ = 0x7f;
  auVar7 = vpmaxsd_avx(auVar7,auVar8);
  auVar7 = vpminsd_avx(auVar7,auVar9);
  auVar7 = vpand_avx(auVar7,_DAT_00a75410);
  auVar1 = vpmovzxdq_avx2(auVar7);
  auVar1 = vpsllvq_avx2(auVar1,_DAT_00a76d00);
  auVar7 = vpor_avx(auVar1._0_16_,auVar1._16_16_);
  auVar8 = vpshufd_avx(auVar7,0xee);
  auVar7 = vpor_avx(auVar7,auVar8);
  return (c_v64)((ulong)((uVar2 & 0xff) << 8 | (uVar5 & 0xff) << 0x10 | uVar3 << 0x18 | uVar4 & 0xff
                        ) | auVar7._0_8_);
}

Assistant:

SIMD_INLINE c_v64 c_v64_pack_s16_s8(c_v64 a, c_v64 b) {
  c_v64 t;
  if (CONFIG_BIG_ENDIAN) {
    c_v64 u = a;
    a = b;
    b = u;
  }
  t.s8[7] = SIMD_CLAMP(a.s16[3], -128, 127);
  t.s8[6] = SIMD_CLAMP(a.s16[2], -128, 127);
  t.s8[5] = SIMD_CLAMP(a.s16[1], -128, 127);
  t.s8[4] = SIMD_CLAMP(a.s16[0], -128, 127);
  t.s8[3] = SIMD_CLAMP(b.s16[3], -128, 127);
  t.s8[2] = SIMD_CLAMP(b.s16[2], -128, 127);
  t.s8[1] = SIMD_CLAMP(b.s16[1], -128, 127);
  t.s8[0] = SIMD_CLAMP(b.s16[0], -128, 127);
  return t;
}